

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVApolynomialStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  uint uVar1;
  CVadjMemRec *pCVar2;
  undefined8 *puVar3;
  sunrealtype *psVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar2 = cv_mem->cv_adj_mem;
  puVar3 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],*puVar3);
  if (pCVar2->ca_IMstoreSensi != 0) {
    uVar1 = cv_mem->cv_Ns;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    psVar4 = cv_mem->cv_cvals;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      psVar4[uVar6] = 1.0;
    }
    iVar5 = N_VScaleVectorArray(uVar1,psVar4,cv_mem->cv_znS[0],puVar3[1]);
    if (iVar5 != 0) {
      return -0x1c;
    }
  }
  *(int *)(puVar3 + 2) = cv_mem->cv_qu;
  return 0;
}

Assistant:

static int CVApolynomialStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVpolynomialDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVpolynomialDataMem)d->content;

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }
    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  content->order = cv_mem->cv_qu;

  return (0);
}